

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
           *this,long *state,long *next)

{
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
  sVar1;
  uint uVar2;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
  *psVar3;
  char cVar4;
  simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
  *psVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  psVar3 = (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
            *)*state;
  uVar2 = *(uint *)(this + 8);
  psVar5 = psVar3;
  if (uVar2 == 0) {
    uVar8 = 0;
  }
  else {
    sVar1 = *this;
    uVar7 = 0;
    do {
      if (psVar5 == (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
                     *)state[4]) {
        *(undefined1 *)((long)state + 0x31) = 1;
        uVar8 = (int)(simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
                      *)state[4] - (int)psVar3;
        break;
      }
      uVar8 = uVar7;
      if (*psVar5 != sVar1) break;
      psVar5 = psVar5 + 1;
      *state = (long)psVar5;
      uVar7 = uVar7 + 1;
      uVar8 = uVar2;
    } while (uVar2 != uVar7);
  }
  if (this[0x18] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
       )0x1) {
    if (*(uint *)(this + 8) <= uVar8) {
      psVar5 = psVar3 + ((simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
                          *)state[4] != psVar3);
    }
    if (uVar8 == 0) {
      psVar5 = psVar3 + ((simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>,mpl_::bool_<true>>
                          *)state[4] != psVar3);
    }
    state[0x12] = (long)psVar5;
  }
  if (uVar8 < *(uint *)(this + 4)) {
LAB_00133b95:
    *state = (long)psVar3;
    bVar6 = false;
  }
  else {
    cVar4 = (**(code **)(*next + 0x10))(next,state);
    bVar6 = true;
    if (cVar4 == '\0') {
      iVar9 = uVar8 + 1;
      do {
        iVar9 = iVar9 + -1;
        if (iVar9 == *(int *)(this + 4)) goto LAB_00133b95;
        *state = *state + -1;
        cVar4 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar4 == '\0');
    }
  }
  return bVar6;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }